

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O2

bool __thiscall libcellml::XmlAttribute::isType(XmlAttribute *this,char *name,char *ns)

{
  int iVar1;
  bool bVar2;
  string local_40;
  
  namespaceUri_abi_cxx11_(&local_40,this);
  iVar1 = xmlStrcmp(local_40._M_dataplus._M_p,ns);
  if (iVar1 == 0) {
    iVar1 = xmlStrcmp(this->mPimpl->mXmlAttributePtr->name,name);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool XmlAttribute::isType(const char *name, const char *ns) const
{
    return (xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0)
           && (xmlStrcmp(mPimpl->mXmlAttributePtr->name, reinterpret_cast<const xmlChar *>(name)) == 0);
}